

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O2

int dprintf_formatf(void *data,_func_int_int_FILE_ptr *stream,char *format,__va_list_tag *ap_save)

{
  char cVar1;
  bool bVar2;
  undefined8 __nptr;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  char *pcVar10;
  uint uVar11;
  byte *buffer;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  int *piVar15;
  anon_union_8_4_dbbb708a_for_data *paVar16;
  anon_union_8_4_dbbb708a_for_data aVar17;
  char **ppcVar18;
  uint *puVar19;
  byte bVar20;
  va_stack_t *pvVar21;
  char *pcVar22;
  int iVar23;
  uint uVar24;
  size_t maxlength;
  char *pcVar25;
  long lVar26;
  ulong uVar27;
  bool bVar28;
  ulong uStack_15b0;
  char *local_1590;
  long local_1588;
  char *local_1570;
  char formatbuf [32];
  char work [256];
  va_stack_t vto [128];
  char *endpos [128];
  
  work._0_8_ = format;
  iVar23 = 0;
  ppcVar18 = endpos;
  local_1590 = (char *)0x0;
LAB_0011e124:
  pcVar12 = (char *)(work._0_8_ + 1);
  do {
    pcVar22 = pcVar12;
    if (pcVar22[-1] == '\0') {
      lVar6 = 0;
      if (0 < (long)local_1590) {
        lVar6 = (long)local_1590;
      }
      pvVar21 = vto;
      lVar5 = 1;
      goto LAB_0011e639;
    }
    if (pcVar22[-1] != '%') {
      work._0_8_ = pcVar22;
      goto LAB_0011e124;
    }
    pcVar12 = pcVar22 + 2;
  } while (*pcVar22 == '%');
  iVar23 = iVar23 + 1;
  work._0_8_ = pcVar22;
  lVar5 = dprintf_DollarString(pcVar22,(char **)work);
  lVar6 = (long)iVar23;
  if (lVar5 != 0) {
    lVar6 = lVar5;
  }
  if ((long)local_1590 < lVar6) {
    local_1590 = (char *)lVar6;
  }
  lVar5 = 0;
  local_1588 = 0;
  uVar24 = 0;
  do {
    __nptr = work._0_8_;
    bVar20 = *(byte *)work._0_8_;
    uVar11 = bVar20 - 0x20;
    if (((0x2f < uVar11) || ((0x900003ff6c09U >> ((ulong)uVar11 & 0x3f) & 1) == 0)) &&
       ((0x12 < bVar20 - 0x68 || ((0x40211U >> (bVar20 - 0x68 & 0x1f) & 1) == 0))))
    goto LAB_0011e34b;
    work._0_8_ = work._0_8_ + 1;
    switch((ulong)uVar11) {
    case 0:
      uVar24 = uVar24 | 1;
    case 1:
    case 2:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 0xc:
    case 0xf:
      break;
    case 3:
      uVar24 = uVar24 | 8;
      break;
    case 10:
      uVar24 = uVar24 | 0x4000;
      iVar23 = iVar23 + 1;
      lVar26 = dprintf_DollarString((char *)work._0_8_,(char **)work);
      lVar5 = (long)iVar23;
      if (lVar26 != 0) {
        lVar5 = lVar26;
      }
      if ((long)local_1590 < lVar5) {
        local_1590 = (char *)lVar5;
      }
      break;
    case 0xb:
      uVar24 = uVar24 | 2;
      break;
    case 0xd:
      uVar24 = uVar24 & 0xfffffefb | 4;
      break;
    case 0xe:
      if (*(char *)work._0_8_ == '*') {
        uVar24 = uVar24 | 0x18000;
        work._0_8_ = __nptr + 2;
        iVar23 = iVar23 + 1;
        lVar26 = dprintf_DollarString((char *)work._0_8_,(char **)work);
        local_1588 = (long)iVar23;
        if (lVar26 != 0) {
          local_1588 = lVar26;
        }
        if ((long)local_1590 < local_1588) {
          local_1590 = (char *)local_1588;
        }
      }
      else {
        uVar24 = uVar24 | 0x8000;
        local_1588 = strtol((char *)work._0_8_,(char **)work,10);
      }
      break;
    case 0x10:
      uVar24 = uVar24 | (~uVar24 & 4) << 6;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
      uVar24 = uVar24 | 0x2000;
      lVar5 = strtol((char *)__nptr,(char **)work,10);
      break;
    default:
      if (bVar20 != 0x4c) {
        if (bVar20 != 0x4f) {
          if (bVar20 == 0x68) {
            uVar24 = uVar24 | 0x10;
            break;
          }
          if (bVar20 == 0x6c) {
            if ((uVar24 & 0x20) != 0) goto LAB_0011e30c;
          }
          else {
            if (bVar20 == 0x71) {
LAB_0011e30c:
              uVar24 = uVar24 | 0x40;
              break;
            }
            if (bVar20 != 0x7a) break;
          }
        }
        uVar24 = uVar24 | 0x20;
        break;
      }
      uVar24 = uVar24 | 0x80;
    }
  } while( true );
LAB_0011e639:
  if (lVar5 - lVar6 == 1) goto LAB_0011e7ac;
  if ((lVar5 < (long)local_1590) && (pvVar21[1].type == FORMAT_WIDTH)) {
    uVar24 = ap_save->gp_offset;
    if ((ulong)uVar24 < 0x29) {
      piVar15 = (int *)((ulong)uVar24 + (long)ap_save->reg_save_area);
      ap_save->gp_offset = uVar24 + 8;
    }
    else {
      piVar15 = (int *)ap_save->overflow_arg_area;
      ap_save->overflow_arg_area = piVar15 + 2;
    }
    pvVar21[1].data = (anon_union_8_4_dbbb708a_for_data)(long)*piVar15;
  }
  switch(pvVar21->type) {
  case FORMAT_UNKNOWN:
  case FORMAT_STRING:
  case FORMAT_PTR:
  case FORMAT_INTPTR:
switchD_0011e68f_caseD_0:
    uVar24 = ap_save->gp_offset;
    if ((ulong)uVar24 < 0x29) {
      paVar16 = (anon_union_8_4_dbbb708a_for_data *)((ulong)uVar24 + (long)ap_save->reg_save_area);
      ap_save->gp_offset = uVar24 + 8;
    }
    else {
      paVar16 = (anon_union_8_4_dbbb708a_for_data *)ap_save->overflow_arg_area;
      ap_save->overflow_arg_area = paVar16 + 1;
    }
    aVar17 = *paVar16;
    goto LAB_0011e6b9;
  case FORMAT_INT:
    uVar24 = pvVar21->flags;
    if ((((~uVar24 & 0x240) == 0) || ((uVar24 & 0x40) != 0)) || ((~uVar24 & 0x220) == 0))
    goto switchD_0011e68f_caseD_0;
    uVar11 = ap_save->gp_offset;
    uVar27 = (ulong)uVar11;
    if ((uVar24 & 0x20) == 0) {
      if ((uVar24 >> 9 & 1) == 0) {
        if (uVar11 < 0x29) {
          piVar15 = (int *)(uVar27 + (long)ap_save->reg_save_area);
          ap_save->gp_offset = uVar11 + 8;
        }
        else {
          piVar15 = (int *)ap_save->overflow_arg_area;
          ap_save->overflow_arg_area = piVar15 + 2;
        }
        aVar17 = (anon_union_8_4_dbbb708a_for_data)(long)*piVar15;
      }
      else {
        if (uVar11 < 0x29) {
          puVar19 = (uint *)(uVar27 + (long)ap_save->reg_save_area);
          ap_save->gp_offset = uVar11 + 8;
        }
        else {
          puVar19 = (uint *)ap_save->overflow_arg_area;
          ap_save->overflow_arg_area = puVar19 + 2;
        }
        aVar17._4_4_ = 0;
        aVar17._0_4_ = *puVar19;
      }
    }
    else {
      if (uVar11 < 0x29) {
        paVar16 = (anon_union_8_4_dbbb708a_for_data *)(uVar27 + (long)ap_save->reg_save_area);
        ap_save->gp_offset = uVar11 + 8;
      }
      else {
        paVar16 = (anon_union_8_4_dbbb708a_for_data *)ap_save->overflow_arg_area;
        ap_save->overflow_arg_area = paVar16 + 1;
      }
      aVar17 = *paVar16;
    }
LAB_0011e6b9:
    pvVar21->data = aVar17;
    break;
  case FORMAT_DOUBLE:
    uVar24 = ap_save->fp_offset;
    if ((ulong)uVar24 < 0xa1) {
      paVar16 = (anon_union_8_4_dbbb708a_for_data *)((ulong)uVar24 + (long)ap_save->reg_save_area);
      ap_save->fp_offset = uVar24 + 0x10;
    }
    else {
      paVar16 = (anon_union_8_4_dbbb708a_for_data *)ap_save->overflow_arg_area;
      ap_save->overflow_arg_area = paVar16 + 1;
    }
    pvVar21->data = *paVar16;
    break;
  case FORMAT_WIDTH:
    pvVar21->type = FORMAT_INT;
  }
  pvVar21 = pvVar21 + 1;
  lVar5 = lVar5 + 1;
  goto LAB_0011e639;
LAB_0011e7ac:
  ppcVar18 = endpos;
  local_1588 = 0;
  local_1590 = "0123456789abcdefghijklmnopqrstuvwxyz";
  iVar23 = 0;
  pcVar12 = format;
  do {
    while( true ) {
      while (local_1570 = pcVar12, cVar1 = *format, cVar1 != '%') {
        if (cVar1 == '\0') {
          return iVar23;
        }
        do {
          iVar3 = (*stream)((int)cVar1,(FILE *)data);
          if (iVar3 == -1) {
            return iVar23;
          }
          iVar23 = iVar23 + 1;
          cVar1 = format[1];
          format = format + 1;
          pcVar12 = format;
        } while ((cVar1 != '\0') && (pcVar12 = format, cVar1 != '%'));
      }
      local_1570 = format + 1;
      if (format[1] != '%') break;
      format = format + 2;
      local_1570 = format;
      iVar3 = (*stream)(0x25,(FILE *)data);
      if (iVar3 == -1) {
        return iVar23;
      }
      iVar23 = iVar23 + 1;
      pcVar12 = local_1570;
    }
    lVar5 = dprintf_DollarString(local_1570,&local_1570);
    lVar6 = lVar5 + -1;
    if (lVar5 == 0) {
      lVar6 = local_1588;
    }
    paVar16 = (anon_union_8_4_dbbb708a_for_data *)&vto[lVar6].width;
    uVar24 = vto[lVar6].flags;
    if ((uVar24 >> 0xe & 1) != 0) {
      paVar16 = &vto[(long)paVar16->str].data;
    }
    pcVar12 = paVar16->str;
    if ((uVar24 >> 0x10 & 1) == 0) {
      local_1588 = local_1588 + 1;
      if ((short)uVar24 < 0) {
        pcVar22 = (char *)vto[lVar6].precision;
      }
      else {
        pcVar22 = (char *)0xffffffffffffffff;
      }
    }
    else {
      pcVar22 = vto[vto[lVar6].precision].data.str;
      local_1588 = local_1588 + 2;
    }
    iVar3 = iVar23;
    switch(vto[lVar6].type) {
    case FORMAT_STRING:
      pcVar13 = vto[lVar6].data.str;
      if (pcVar13 == (char *)0x0) {
        if (pcVar22 == (char *)0xffffffffffffffff || 4 < (long)pcVar22) {
          uVar24 = uVar24 & 0xfffffff7;
          vto[lVar6].flags = uVar24;
          pcVar13 = "(nil)";
          pcVar10 = (char *)0x5;
        }
        else {
          pcVar13 = "";
          pcVar10 = (char *)0x0;
        }
      }
      else {
        pcVar10 = (char *)strlen(pcVar13);
      }
      pcVar25 = pcVar10;
      if (pcVar22 < pcVar10) {
        pcVar25 = pcVar22;
      }
      if (pcVar22 == (char *)0xffffffffffffffff) {
        pcVar25 = pcVar10;
      }
      if ((uVar24 & 8) != 0) {
        iVar3 = (*stream)(0x22,(FILE *)data);
        if (iVar3 == -1) {
          return iVar23;
        }
        iVar23 = iVar23 + 1;
        uVar24 = vto[lVar6].flags;
      }
      uVar14 = (long)pcVar12 - (long)pcVar25;
      uVar27 = uVar14;
      if ((uVar24 & 4) == 0) {
        uVar9 = (long)uVar14 >> 0x3f & uVar14;
        for (; uVar27 = uVar9 - 1, 0 < (long)uVar14; uVar14 = uVar14 - 1) {
          iVar3 = (*stream)(0x20,(FILE *)data);
          if (iVar3 == -1) {
            return iVar23;
          }
          iVar23 = iVar23 + 1;
        }
      }
      iVar3 = iVar23 + (int)pcVar25;
      for (pcVar12 = (char *)0x0; pcVar25 != pcVar12; pcVar12 = pcVar12 + 1) {
        iVar4 = (*stream)((int)pcVar13[(long)pcVar12],(FILE *)data);
        if (iVar4 == -1) {
LAB_0011f0e5:
          return iVar23 + (int)pcVar12;
        }
      }
      uVar24 = vto[lVar6].flags;
      if ((uVar24 & 4) != 0) {
        for (; 0 < (long)uVar27; uVar27 = uVar27 - 1) {
          iVar23 = (*stream)(0x20,(FILE *)data);
          if (iVar23 == -1) {
            return iVar3;
          }
          iVar3 = iVar3 + 1;
        }
        uVar24 = vto[lVar6].flags;
      }
      if ((uVar24 & 8) != 0) {
        iVar23 = (*stream)(0x22,(FILE *)data);
        if (iVar23 == -1) {
          return iVar3;
        }
        iVar3 = iVar3 + 1;
      }
      break;
    case FORMAT_PTR:
      pcVar13 = vto[lVar6].data.str;
      if (pcVar13 != (char *)0x0) {
        local_1590 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
        if ((uVar24 >> 0xc & 1) == 0) {
          local_1590 = "0123456789abcdefghijklmnopqrstuvwxyz";
        }
        uVar11 = 1;
LAB_0011e9c0:
        bVar2 = false;
        bVar20 = 1;
        uStack_15b0 = 0x10;
        pcVar10 = pcVar13;
        goto LAB_0011ee08;
      }
      pcVar12 = pcVar12 + -5;
      pcVar22 = pcVar12;
      if ((uVar24 & 4) != 0) {
        pcVar22 = (char *)(((long)pcVar12 >> 0x3f & (ulong)pcVar12) - 1);
        for (; 0 < (long)pcVar12; pcVar12 = pcVar12 + -1) {
          iVar3 = (*stream)(0x20,(FILE *)data);
          if (iVar3 == -1) {
            return iVar23;
          }
          iVar23 = iVar23 + 1;
        }
      }
      iVar3 = iVar23 + 5;
      for (pcVar12 = (char *)0x0; pcVar12 != (char *)0x5; pcVar12 = pcVar12 + 1) {
        iVar4 = (*stream)((int)pcVar12[0x137ce4],(FILE *)data);
        if (iVar4 == -1) goto LAB_0011f0e5;
      }
      if ((vto[lVar6].flags & 4) == 0) {
        for (; 0 < (long)pcVar22; pcVar22 = pcVar22 + -1) {
          iVar23 = (*stream)(0x20,(FILE *)data);
          if (iVar23 == -1) {
            return iVar3;
          }
          iVar3 = iVar3 + 1;
        }
      }
    default:
switchD_0011e8e8_caseD_5:
      break;
    case FORMAT_INT:
      pcVar13 = vto[lVar6].data.str;
      if ((uVar24 >> 0x11 & 1) != 0) {
        if ((uVar24 & 4) == 0) {
          for (; 1 < (long)pcVar12; pcVar12 = pcVar12 + -1) {
            iVar3 = (*stream)(0x20,(FILE *)data);
            if (iVar3 == -1) {
              return iVar23;
            }
            iVar23 = iVar23 + 1;
          }
          pcVar12 = pcVar12 + -1;
        }
        iVar3 = (*stream)((uint)pcVar13 & 0xff,(FILE *)data);
        if (iVar3 == -1) {
          return iVar23;
        }
        iVar3 = iVar23 + 1;
        if ((vto[lVar6].flags & 4) != 0) {
          for (; 1 < (long)pcVar12; pcVar12 = pcVar12 + -1) {
            iVar23 = (*stream)(0x20,(FILE *)data);
            if (iVar23 == -1) {
              return iVar3;
            }
            iVar3 = iVar3 + 1;
          }
        }
        goto switchD_0011e8e8_caseD_5;
      }
      uVar11 = uVar24 >> 3 & 1;
      pcVar10 = pcVar13;
      if ((uVar24 >> 9 & 1) == 0) {
        if ((uVar24 >> 10 & 1) != 0) {
          bVar20 = 0;
          bVar2 = true;
          uStack_15b0 = 8;
          goto LAB_0011ee08;
        }
        if ((uVar24 >> 0xb & 1) != 0) {
          local_1590 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
          if ((uVar24 >> 0xc & 1) == 0) {
            local_1590 = "0123456789abcdefghijklmnopqrstuvwxyz";
          }
          goto LAB_0011e9c0;
        }
        pcVar10 = (char *)-(long)pcVar13;
        if (0 < (long)pcVar13) {
          pcVar10 = pcVar13;
        }
        bVar28 = -1 < (long)pcVar13;
        bVar2 = false;
        bVar20 = 0;
        uStack_15b0 = 10;
      }
      else {
        bVar2 = false;
        bVar20 = 0;
        uStack_15b0 = 10;
LAB_0011ee08:
        bVar28 = true;
      }
      lVar5 = 0;
      for (; pcVar10 != (char *)0x0; pcVar10 = (char *)((ulong)pcVar10 / uStack_15b0)) {
        work[lVar5 + 0xff] = local_1590[(ulong)pcVar10 % uStack_15b0];
        lVar5 = lVar5 + -1;
      }
      if (pcVar22 == (char *)0xffffffffffffffff) {
        pcVar22 = (char *)0x1;
      }
      pcVar22 = pcVar22 + lVar5;
      if ((bVar2 && uVar11 != 0) && ((long)pcVar22 < 1)) {
        work[lVar5 + 0xff] = '0';
        pcVar12 = pcVar12 + lVar5 + -1;
        lVar5 = lVar5 + 0xfe;
      }
      else {
        pcVar12 = pcVar12 + lVar5;
        lVar5 = lVar5 + 0xff;
        pcVar13 = pcVar22;
        if (0 < (long)pcVar22) {
          for (; 0 < (long)pcVar13; pcVar13 = pcVar13 + -1) {
            work[lVar5] = '0';
            lVar5 = lVar5 + -1;
          }
          pcVar12 = pcVar12 + -(long)pcVar22;
        }
      }
      bVar20 = (byte)uVar11 & bVar20;
      pcVar22 = pcVar12 + -2;
      if (bVar20 == 0) {
        pcVar22 = pcVar12;
      }
      uVar14 = (long)pcVar22 - (ulong)(byte)(bVar28 ^ 1U | (uVar24 & 3) != 0);
      uVar27 = uVar14;
      if ((uVar24 & 0x104) == 0) {
        uVar27 = ((long)uVar14 >> 0x3f & uVar14) - 1;
        for (; 0 < (long)uVar14; uVar14 = uVar14 - 1) {
          iVar23 = (*stream)(0x20,(FILE *)data);
          if (iVar23 == -1) {
            return iVar3;
          }
          iVar3 = iVar3 + 1;
        }
      }
      if (bVar28 == false) {
        uStack_15b0._0_4_ = 0x2d;
LAB_0011ef1b:
        iVar23 = (*stream)((int)uStack_15b0,(FILE *)data);
        if (iVar23 == -1) {
          return iVar3;
        }
        iVar3 = iVar3 + 1;
      }
      else {
        if ((vto[lVar6].flags & 2U) != 0) {
          uStack_15b0._0_4_ = 0x2b;
          goto LAB_0011ef1b;
        }
        if ((vto[lVar6].flags & 1U) != 0) {
          uStack_15b0._0_4_ = 0x20;
          goto LAB_0011ef1b;
        }
      }
      if (bVar20 != 0) {
        iVar23 = (*stream)(0x30,(FILE *)data);
        if (iVar23 == -1) {
          return iVar3;
        }
        if ((vto[lVar6].flags & 0x1000) == 0) {
          uStack_15b0._0_4_ = 0x78;
        }
        else {
          uStack_15b0._0_4_ = 0x58;
        }
        iVar23 = (*stream)((int)uStack_15b0,(FILE *)data);
        if (iVar23 == -1) {
          return iVar3 + 1;
        }
        iVar3 = iVar3 + 2;
      }
      uVar14 = uVar27;
      if ((vto[lVar6].flags & 0x104U) == 0x100) {
        uVar14 = ((long)uVar27 >> 0x3f & uVar27) - 1;
        for (; 0 < (long)uVar27; uVar27 = uVar27 - 1) {
          iVar23 = (*stream)(0x30,(FILE *)data);
          if (iVar23 == -1) {
            return iVar3;
          }
          iVar3 = iVar3 + 1;
        }
      }
      for (; lVar5 < 0xff; lVar5 = lVar5 + 1) {
        iVar23 = (*stream)((int)work[lVar5 + 1],(FILE *)data);
        if (iVar23 == -1) {
          return iVar3;
        }
        iVar3 = iVar3 + 1;
      }
      if ((vto[lVar6].flags & 4) != 0) {
        for (; 0 < (long)uVar14; uVar14 = uVar14 - 1) {
          iVar23 = (*stream)(0x20,(FILE *)data);
          if (iVar23 == -1) {
            return iVar3;
          }
          iVar3 = iVar3 + 1;
        }
      }
      break;
    case FORMAT_INTPTR:
      if ((uVar24 & 0x40) != 0) {
        *(long *)vto[lVar6].data.str = (long)iVar23;
        goto switchD_0011e8e8_caseD_5;
      }
      if ((uVar24 & 0x20) == 0) {
        if ((uVar24 & 0x10) == 0) {
          *(int *)vto[lVar6].data.str = iVar23;
        }
        else {
          *(short *)vto[lVar6].data.str = (short)iVar23;
        }
      }
      else {
        *(long *)vto[lVar6].data.str = (long)iVar23;
      }
      break;
    case FORMAT_DOUBLE:
      formatbuf[0x10] = '\0';
      formatbuf[0x11] = '\0';
      formatbuf[0x12] = '\0';
      formatbuf[0x13] = '\0';
      formatbuf[0x14] = '\0';
      formatbuf[0x15] = '\0';
      formatbuf[0x16] = '\0';
      formatbuf[0x17] = '\0';
      formatbuf[0x18] = '\0';
      formatbuf[0x19] = '\0';
      formatbuf[0x1a] = '\0';
      formatbuf[0x1b] = '\0';
      formatbuf[0x1c] = '\0';
      formatbuf[0x1d] = '\0';
      formatbuf[0x1e] = '\0';
      formatbuf[0x1f] = '\0';
      formatbuf[0] = '%';
      formatbuf[1] = '\0';
      formatbuf[2] = '\0';
      formatbuf[3] = '\0';
      formatbuf[4] = '\0';
      formatbuf[5] = '\0';
      formatbuf[6] = '\0';
      formatbuf[7] = '\0';
      formatbuf[8] = '\0';
      formatbuf[9] = '\0';
      formatbuf[10] = '\0';
      formatbuf[0xb] = '\0';
      formatbuf[0xc] = '\0';
      formatbuf[0xd] = '\0';
      formatbuf[0xe] = '\0';
      formatbuf[0xf] = '\0';
      sVar7 = strlen(formatbuf);
      if ((uVar24 >> 0xd & 1) == 0) {
        pcVar12 = (char *)0xffffffffffffffff;
        if ((uVar24 >> 0xe & 1) != 0) {
          paVar16 = &vto[vto[lVar6].width].data;
          goto LAB_0011ea9b;
        }
      }
      else {
        paVar16 = (anon_union_8_4_dbbb708a_for_data *)&vto[lVar6].width;
LAB_0011ea9b:
        pcVar12 = paVar16->str;
      }
      if ((short)uVar24 < 0) {
        paVar16 = (anon_union_8_4_dbbb708a_for_data *)&vto[lVar6].precision;
LAB_0011eac8:
        pcVar22 = paVar16->str;
      }
      else {
        pcVar22 = (char *)0xffffffffffffffff;
        if ((uVar24 >> 0x10 & 1) != 0) {
          paVar16 = &vto[vto[lVar6].precision].data;
          goto LAB_0011eac8;
        }
      }
      if ((uVar24 & 4) != 0) {
        sVar8 = strlen(formatbuf);
        (formatbuf + sVar8)[0] = '-';
        (formatbuf + sVar8)[1] = '\0';
      }
      if ((uVar24 & 2) != 0) {
        sVar8 = strlen(formatbuf);
        (formatbuf + sVar8)[0] = '+';
        (formatbuf + sVar8)[1] = '\0';
      }
      if ((uVar24 & 1) != 0) {
        sVar8 = strlen(formatbuf);
        (formatbuf + sVar8)[0] = ' ';
        (formatbuf + sVar8)[1] = '\0';
      }
      if ((uVar24 & 8) != 0) {
        sVar8 = strlen(formatbuf);
        (formatbuf + sVar8)[0] = '#';
        (formatbuf + sVar8)[1] = '\0';
      }
      maxlength = 0x20 - sVar7;
      sVar7 = strlen(formatbuf);
      buffer = (byte *)(formatbuf + sVar7);
      if (-1 < (long)pcVar12) {
        iVar23 = curl_msnprintf((char *)buffer,maxlength,"%ld");
        buffer = buffer + iVar23;
        maxlength = maxlength - (long)iVar23;
      }
      if (-1 < (long)pcVar22) {
        iVar23 = curl_msnprintf((char *)buffer,maxlength,".%ld");
        buffer = buffer + iVar23;
      }
      uVar24 = vto[lVar6].flags;
      if ((uVar24 & 0x20) != 0) {
        *buffer = 0x6c;
        buffer = buffer + 1;
        uVar24 = vto[lVar6].flags;
      }
      if ((uVar24 >> 0x12 & 1) == 0) {
        bVar20 = 0x66;
        if ((uVar24 >> 0x13 & 1) != 0) {
          bVar20 = ((uVar24 >> 0xc & 1) == 0) << 5 | 0x47;
        }
      }
      else {
        bVar20 = ((uVar24 >> 0xc & 1) == 0) << 5 | 0x45;
      }
      *buffer = bVar20;
      buffer[1] = 0;
      pcVar12 = work;
      sprintf(pcVar12,formatbuf,SUB84(vto[lVar6].data,0));
      for (; *pcVar12 != '\0'; pcVar12 = pcVar12 + 1) {
        iVar23 = (*stream)((int)*pcVar12,(FILE *)data);
        if (iVar23 == -1) {
          return iVar3;
        }
        iVar3 = iVar3 + 1;
      }
    }
    format = *ppcVar18;
    ppcVar18 = ppcVar18 + 1;
    iVar23 = iVar3;
    pcVar12 = format;
  } while( true );
LAB_0011e34b:
  lVar6 = lVar6 + -1;
  switch(bVar20) {
  case 99:
    vto[lVar6].type = FORMAT_INT;
    uVar24 = uVar24 | 0x20000;
    break;
  case 100:
  case 0x69:
    vto[lVar6].type = FORMAT_INT;
    break;
  case 0x65:
    vto[lVar6].type = FORMAT_DOUBLE;
    uVar24 = uVar24 | 0x40000;
    break;
  case 0x66:
    vto[lVar6].type = FORMAT_DOUBLE;
    break;
  case 0x67:
    vto[lVar6].type = FORMAT_DOUBLE;
    uVar24 = uVar24 | 0x80000;
    break;
  case 0x6e:
    vto[lVar6].type = FORMAT_INTPTR;
    break;
  case 0x6f:
    vto[lVar6].type = FORMAT_INT;
    uVar24 = uVar24 | 0x400;
    break;
  case 0x70:
    vto[lVar6].type = FORMAT_PTR;
    break;
  case 0x73:
switchD_0011e377_caseD_73:
    vto[lVar6].type = FORMAT_STRING;
    break;
  case 0x75:
    vto[lVar6].type = FORMAT_INT;
    uVar24 = uVar24 | 0x200;
    break;
  case 0x78:
    vto[lVar6].type = FORMAT_INT;
    uVar24 = uVar24 | 0x800;
    break;
  default:
    if (bVar20 == 0x45) {
      vto[lVar6].type = FORMAT_DOUBLE;
      uVar24 = uVar24 | 0x41000;
      break;
    }
    if (bVar20 == 0x47) {
      vto[lVar6].type = FORMAT_DOUBLE;
      uVar24 = uVar24 | 0x81000;
      break;
    }
    if (bVar20 == 0x58) {
      vto[lVar6].type = FORMAT_INT;
      uVar24 = uVar24 | 0x1800;
      break;
    }
    if (bVar20 == 0x53) {
      uVar24 = uVar24 | 8;
      goto switchD_0011e377_caseD_73;
    }
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
    vto[lVar6].type = FORMAT_UNKNOWN;
  }
  vto[lVar6].flags = uVar24;
  vto[lVar6].width = lVar5;
  vto[lVar6].precision = local_1588;
  lVar26 = lVar6;
  if ((uVar24 >> 0xe & 1) != 0) {
    lVar26 = lVar5 + -1;
    vto[lVar6].width = lVar26;
    vto[lVar26].type = FORMAT_WIDTH;
    *(undefined8 *)&vto[lVar26].flags = 0;
    *(undefined8 *)((long)&vto[lVar26].width + 4) = 0;
    *(undefined4 *)((long)&vto[lVar26].precision + 4) = 0;
  }
  if ((uVar24 >> 0x10 & 1) != 0) {
    local_1588 = local_1588 + -1;
    vto[lVar26].precision = local_1588;
    vto[local_1588].type = FORMAT_WIDTH;
    *(undefined8 *)&vto[local_1588].flags = 0;
    *(undefined8 *)((long)&vto[local_1588].width + 4) = 0;
    *(undefined4 *)((long)&vto[local_1588].precision + 4) = 0;
  }
  *ppcVar18 = (char *)(work._0_8_ + 1);
  ppcVar18 = ppcVar18 + 1;
  goto LAB_0011e124;
}

Assistant:

static int dprintf_formatf(
  void *data, /* untouched by format(), just sent to the stream() function in
                 the second argument */
  /* function pointer called for each output character */
  int (*stream)(int, FILE *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  /* Base-36 digits for numbers.  */
  const char *digits = lower_digits;

  /* Pointer into the format string.  */
  char *f;

  /* Number of characters written.  */
  int done = 0;

  long param; /* current parameter to read */
  long param_num=0; /* parameter counter */

  va_stack_t vto[MAX_PARAMETERS];
  char *endpos[MAX_PARAMETERS];
  char **end;

  char work[BUFFSIZE];

  va_stack_t *p;

  /* Do the actual %-code parsing */
  dprintf_Pass1(format, vto, endpos, ap_save);

  end = &endpos[0]; /* the initial end-position from the list dprintf_Pass1()
                       created for us */

  f = (char *)format;
  while(*f != '\0') {
    /* Format spec modifiers.  */
    int is_alt;

    /* Width of a field.  */
    long width;

    /* Precision of a field.  */
    long prec;

    /* Decimal integer is negative.  */
    int is_neg;

    /* Base of a number to be written.  */
    long base;

    /* Integral values to be written.  */
    mp_uintmax_t num;

    /* Used to convert negative in positive.  */
    mp_intmax_t signed_num;

    if(*f != '%') {
      /* This isn't a format spec, so write everything out until the next one
         OR end of string is reached.  */
      do {
        OUTCHAR(*f);
      } while(*++f && ('%' != *f));
      continue;
    }

    ++f;

    /* Check for "%%".  Note that although the ANSI standard lists
       '%' as a conversion specifier, it says "The complete format
       specification shall be `%%'," so we can avoid all the width
       and precision processing.  */
    if(*f == '%') {
      ++f;
      OUTCHAR('%');
      continue;
    }

    /* If this is a positional parameter, the position must follow immediately
       after the %, thus create a %<num>$ sequence */
    param=dprintf_DollarString(f, &f);

    if(!param)
      param = param_num;
    else
      --param;

    param_num++; /* increase this always to allow "%2$s %1$s %s" and then the
                    third %s will pick the 3rd argument */

    p = &vto[param];

    /* pick up the specified width */
    if(p->flags & FLAGS_WIDTHPARAM)
      width = (long)vto[p->width].data.num.as_signed;
    else
      width = p->width;

    /* pick up the specified precision */
    if(p->flags & FLAGS_PRECPARAM) {
      prec = (long)vto[p->precision].data.num.as_signed;
      param_num++; /* since the precision is extraced from a parameter, we
                      must skip that to get to the next one properly */
    }
    else if(p->flags & FLAGS_PREC)
      prec = p->precision;
    else
      prec = -1;

    is_alt = (p->flags & FLAGS_ALT) ? 1 : 0;

    switch (p->type) {
    case FORMAT_INT:
      num = p->data.num.as_unsigned;
      if(p->flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(p->flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(p->flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(p->flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer.  */
        base = 10;
        goto unsigned_number;
      }
      if(p->flags & FLAGS_OCTAL) {
        /* Octal unsigned integer.  */
        base = 8;
        goto unsigned_number;
      }
      if(p->flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer.  */

        digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
        base = 16;
        goto unsigned_number;
      }

      /* Decimal integer.  */
      base = 10;

      is_neg = (p->data.num.as_signed < (mp_intmax_t)0) ? 1 : 0;
      if(is_neg) {
        /* signed_num might fail to hold absolute negative minimum by 1 */
        signed_num = p->data.num.as_signed + (mp_intmax_t)1;
        signed_num = -signed_num;
        num = (mp_uintmax_t)signed_num;
        num += (mp_uintmax_t)1;
      }

      goto number;

      unsigned_number:
      /* Unsigned number of base BASE.  */
      is_neg = 0;

      number:
      /* Number of base BASE.  */
      {
        char *workend = &work[sizeof(work) - 1];
        char *w;

        /* Supply a default precision if none was given.  */
        if(prec == -1)
          prec = 1;

        /* Put the number in WORK.  */
        w = workend;
        while(num > 0) {
          *w-- = digits[num % base];
          num /= base;
        }
        width -= (long)(workend - w);
        prec -= (long)(workend - w);

        if(is_alt && base == 8 && prec <= 0) {
          *w-- = '0';
          --width;
        }

        if(prec > 0) {
          width -= prec;
          while(prec-- > 0)
            *w-- = '0';
        }

        if(is_alt && base == 16)
          width -= 2;

        if(is_neg || (p->flags & FLAGS_SHOWSIGN) || (p->flags & FLAGS_SPACE))
          --width;

        if(!(p->flags & FLAGS_LEFT) && !(p->flags & FLAGS_PAD_NIL))
          while(width-- > 0)
            OUTCHAR(' ');

        if(is_neg)
          OUTCHAR('-');
        else if(p->flags & FLAGS_SHOWSIGN)
          OUTCHAR('+');
        else if(p->flags & FLAGS_SPACE)
          OUTCHAR(' ');

        if(is_alt && base == 16) {
          OUTCHAR('0');
          if(p->flags & FLAGS_UPPER)
            OUTCHAR('X');
          else
            OUTCHAR('x');
        }

        if(!(p->flags & FLAGS_LEFT) && (p->flags & FLAGS_PAD_NIL))
          while(width-- > 0)
            OUTCHAR('0');

        /* Write the number.  */
        while(++w <= workend) {
          OUTCHAR(*w);
        }

        if(p->flags & FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');
      }
      break;

    case FORMAT_STRING:
            /* String.  */
      {
        static const char null[] = "(nil)";
        const char *str;
        size_t len;

        str = (char *) p->data.str;
        if(str == NULL) {
          /* Write null[] if there's space.  */
          if(prec == -1 || prec >= (long) sizeof(null) - 1) {
            str = null;
            len = sizeof(null) - 1;
            /* Disable quotes around (nil) */
            p->flags &= (~FLAGS_ALT);
          }
          else {
            str = "";
            len = 0;
          }
        }
        else
          len = strlen(str);

        if(prec != -1 && (size_t) prec < len)
          len = (size_t)prec;
        width -= (long)len;

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');

        if(!(p->flags&FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');

        while(len-- > 0)
          OUTCHAR(*str++);
        if(p->flags&FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');
      }
      break;

    case FORMAT_PTR:
      /* Generic pointer.  */
      {
        void *ptr;
        ptr = (void *) p->data.ptr;
        if(ptr != NULL) {
          /* If the pointer is not NULL, write it as a %#x spec.  */
          base = 16;
          digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
          is_alt = 1;
          num = (size_t) ptr;
          is_neg = 0;
          goto number;
        }
        else {
          /* Write "(nil)" for a nil pointer.  */
          static const char strnil[] = "(nil)";
          const char *point;

          width -= (long)(sizeof(strnil) - 1);
          if(p->flags & FLAGS_LEFT)
            while(width-- > 0)
              OUTCHAR(' ');
          for(point = strnil; *point != '\0'; ++point)
            OUTCHAR(*point);
          if(! (p->flags & FLAGS_LEFT))
            while(width-- > 0)
              OUTCHAR(' ');
        }
      }
      break;

    case FORMAT_DOUBLE:
      {
        char formatbuf[32]="%";
        char *fptr;
        size_t left = sizeof(formatbuf)-strlen(formatbuf);
        int len;

        width = -1;
        if(p->flags & FLAGS_WIDTH)
          width = p->width;
        else if(p->flags & FLAGS_WIDTHPARAM)
          width = (long)vto[p->width].data.num.as_signed;

        prec = -1;
        if(p->flags & FLAGS_PREC)
          prec = p->precision;
        else if(p->flags & FLAGS_PRECPARAM)
          prec = (long)vto[p->precision].data.num.as_signed;

        if(p->flags & FLAGS_LEFT)
          strcat(formatbuf, "-");
        if(p->flags & FLAGS_SHOWSIGN)
          strcat(formatbuf, "+");
        if(p->flags & FLAGS_SPACE)
          strcat(formatbuf, " ");
        if(p->flags & FLAGS_ALT)
          strcat(formatbuf, "#");

        fptr=&formatbuf[strlen(formatbuf)];

        if(width >= 0) {
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, "%ld", width);
          fptr += len;
          left -= len;
        }
        if(prec >= 0) {
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, ".%ld", prec);
          fptr += len;
        }
        if(p->flags & FLAGS_LONG)
          *fptr++ = 'l';

        if(p->flags & FLAGS_FLOATE)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'E':'e');
        else if(p->flags & FLAGS_FLOATG)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'G' : 'g');
        else
          *fptr++ = 'f';

        *fptr = 0; /* and a final zero termination */

        /* NOTE NOTE NOTE!! Not all sprintf() implementations returns number
           of output characters */
        (sprintf)(work, formatbuf, p->data.dnum);

        for(fptr=work; *fptr; fptr++)
          OUTCHAR(*fptr);
      }
      break;

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(p->flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) p->data.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(p->flags & FLAGS_LONG)
          *(long *) p->data.ptr = (long)done;
      else if(!(p->flags & FLAGS_SHORT))
        *(int *) p->data.ptr = (int)done;
      else
        *(short *) p->data.ptr = (short)done;
      break;

    default:
      break;
    }
    f = *end++; /* goto end of %-code */

  }
  return done;
}